

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layout.c++
# Opt level: O1

SegmentAnd<capnp::word_*>
capnp::_::WireHelpers::setStructPointer
          (SegmentBuilder *segment,CapTableBuilder *capTable,WirePointer *ref,StructReader value,
          BuilderArena *orphanArena,bool canonical)

{
  WirePointer *pWVar1;
  BuilderArena *this;
  ulong uVar2;
  SegmentBuilder *pSVar3;
  long lVar4;
  word *pwVar5;
  WirePointer *pWVar6;
  long lVar7;
  undefined7 in_register_00000081;
  word *pwVar8;
  uint uVar9;
  uint uVar10;
  long lVar11;
  uint uVar12;
  bool bVar14;
  AllocateResult AVar15;
  SegmentAnd<capnp::word_*> SVar16;
  bool _kjCondition;
  word *local_68;
  anon_class_1_0_00000001 local_59;
  WirePointer *local_58;
  ulong local_50;
  int local_44;
  CapTableBuilder *local_40;
  Fault f;
  ulong uVar13;
  
  pWVar6 = (WirePointer *)(ulong)value.dataSize;
  uVar12 = value.dataSize + 7 >> 3;
  uVar13 = (ulong)uVar12;
  uVar10 = (uint)value.pointerCount;
  local_44 = (int)CONCAT71(in_register_00000081,canonical);
  local_40 = capTable;
  if (local_44 != 0) {
    bVar14 = ((undefined1  [48])value & (undefined1  [48])0x7) == (undefined1  [48])0x0;
    _kjCondition = bVar14 || pWVar6 == (WirePointer *)0x1;
    if (!bVar14 && pWVar6 != (WirePointer *)0x1) {
      kj::_::Debug::Fault::Fault<kj::Exception::Type,bool&>
                (&f,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/layout.c++"
                 ,0x6f0,FAILED,
                 "(value.dataSize == ONE * BITS) || (value.dataSize % BITS_PER_BYTE == ZERO * BITS)"
                 ,"_kjCondition,",&_kjCondition);
      kj::_::Debug::Fault::fatal(&f);
    }
    if (value.dataSize == 1) {
      if ((*value.data & 1) == 0) {
        uVar13 = 0;
      }
    }
    else {
      uVar2 = (ulong)(value.dataSize >> 3);
      do {
        uVar13 = uVar2;
        if ((void *)(uVar13 + (long)value.data) <= value.data) break;
        uVar2 = uVar13 - 1;
      } while (*(char *)((long)value.data + (uVar13 - 1)) == '\0');
    }
    uVar12 = (uint)uVar13;
    lVar7 = (ulong)value.pointerCount << 3;
    do {
      lVar11 = lVar7;
      pWVar1 = (WirePointer *)((long)&((value.pointers)->offsetAndKind).value + lVar11);
      if (pWVar1 <= value.pointers) break;
      lVar7 = lVar11 + -8;
    } while (pWVar1[-1].field_1.upper32Bits == 0 && pWVar1[-1].offsetAndKind.value == 0);
    uVar10 = (uint)lVar11 >> 3;
  }
  uVar9 = uVar12 + 7 >> 3;
  pwVar8 = (word *)(ulong)uVar9;
  local_50 = (ulong)(uVar10 & 0xffff);
  uVar9 = uVar9 + (uVar10 & 0xffff);
  if (orphanArena == (BuilderArena *)0x0) {
    if ((ref->field_1).upper32Bits != 0 || (ref->offsetAndKind).value != 0) {
      local_68 = pwVar8;
      local_58 = ref;
      zeroObject(segment,capTable,ref);
      ref = local_58;
      pwVar8 = local_68;
    }
    AVar15.words = (word *)ref;
    AVar15.segment = segment;
    if (uVar9 == 0) {
      (ref->offsetAndKind).value = 0xfffffffc;
    }
    else {
      pwVar5 = segment->pos;
      if ((long)((long)(segment->super_SegmentReader).ptr.ptr +
                ((segment->super_SegmentReader).ptr.size_ * 8 - (long)pwVar5)) >> 3 <
          (long)(ulong)uVar9) {
        pwVar5 = (word *)0x0;
      }
      else {
        segment->pos = pwVar5 + uVar9;
      }
      AVar15.words = pwVar5;
      if (pwVar5 == (word *)0x0) {
        this = (BuilderArena *)(segment->super_SegmentReader).arena;
        local_68 = pwVar8;
        local_58 = pWVar6;
        if (0x1ffffffe < uVar9) {
          allocate::anon_class_1_0_00000001::operator()(&local_59);
        }
        AVar15 = BuilderArena::allocate(this,uVar9 + 1);
        pWVar6 = (WirePointer *)AVar15.words;
        pSVar3 = AVar15.segment;
        (ref->offsetAndKind).value =
             (int)AVar15.words - *(int *)&(pSVar3->super_SegmentReader).ptr.ptr & 0xfffffff8U | 2;
        ref->field_1 = (anon_union_4_5_35ddcec3_for_WirePointer_1)
                       (pSVar3->super_SegmentReader).id.value;
        (pWVar6->offsetAndKind).value = 0;
        AVar15.words = (word *)(pWVar6 + 1);
        AVar15.segment = pSVar3;
        value.dataSize = (StructDataBitCount)local_58;
        ref = pWVar6;
        pwVar8 = local_68;
      }
      else {
        (ref->offsetAndKind).value =
             ((uint)((ulong)((long)pwVar5 - (long)ref) >> 1) & 0xfffffffc) - 4;
      }
    }
  }
  else {
    AVar15 = BuilderArena::allocate(orphanArena,uVar9);
    (ref->offsetAndKind).value = 0xfffffffc;
  }
  local_68 = AVar15.words;
  (ref->field_1).structRef.dataSize.value = (unsigned_short)pwVar8;
  (ref->field_1).structRef.ptrCount.value = (unsigned_short)uVar10;
  if (value.dataSize == 1) {
    if (uVar12 != 0) {
      *(byte *)&local_68->content = *value.data & 1;
    }
  }
  else if (uVar12 != 0) {
    memcpy(local_68,value.data,(ulong)uVar12);
  }
  if ((unsigned_short)uVar10 != 0) {
    pWVar6 = (WirePointer *)(local_68 + ((ulong)pwVar8 & 0xffffffff));
    local_50 = (ulong)(uint)((int)local_50 << 3);
    lVar11 = 8;
    lVar7 = -8;
    bVar14 = local_44._0_1_;
    do {
      lVar4 = (long)(*(int *)((long)&value.pointers[-1].offsetAndKind.value + lVar11) >> 2);
      if (value.segment == (SegmentReader *)0x0) {
        pwVar8 = (word *)((long)&value.pointers[lVar4].offsetAndKind.value + lVar11);
      }
      else {
        pwVar5 = ((value.segment)->ptr).ptr;
        pwVar8 = pwVar5 + ((value.segment)->ptr).size_;
        if (((long)pwVar5 + (lVar7 - (long)value.pointers) >> 3 <= lVar4) &&
           (lVar4 <= (long)pwVar8 + (lVar7 - (long)value.pointers) >> 3)) {
          pwVar8 = (word *)((long)&value.pointers[lVar4].offsetAndKind.value + lVar11);
        }
      }
      copyPointer(AVar15.segment,local_40,pWVar6,value.segment,value.capTable,
                  (WirePointer *)((long)&value.pointers[-1].offsetAndKind.value + lVar11),pwVar8,
                  value.nestingLimit,(BuilderArena *)0x0,bVar14);
      pWVar6 = pWVar6 + 1;
      lVar11 = lVar11 + 8;
      lVar4 = local_50 + lVar7;
      lVar7 = lVar7 + -8;
    } while (lVar4 != 0);
  }
  SVar16.value = local_68;
  SVar16.segment = AVar15.segment;
  return SVar16;
}

Assistant:

static SegmentAnd<word*> setStructPointer(
      SegmentBuilder* segment, CapTableBuilder* capTable, WirePointer* ref, StructReader value,
      BuilderArena* orphanArena = nullptr, bool canonical = false) {
    auto dataSize = roundBitsUpToBytes(value.dataSize);
    auto ptrCount = value.pointerCount;

    if (canonical) {
      // StructReaders should not have bitwidths other than 1, but let's be safe
      KJ_REQUIRE((value.dataSize == ONE * BITS)
                 || (value.dataSize % BITS_PER_BYTE == ZERO * BITS));

      if (value.dataSize == ONE * BITS) {
        // Handle the truncation case where it's a false in a 1-bit struct
        if (!value.getDataField<bool>(ZERO * ELEMENTS)) {
          dataSize = ZERO * BYTES;
        }
      } else {
        // Truncate the data section
        auto data = value.getDataSectionAsBlob();
        auto end = data.end();
        while (end > data.begin() && end[-1] == 0) --end;
        dataSize = intervalLength(data.begin(), end, MAX_STRUCT_DATA_WORDS * BYTES_PER_WORD);
      }

      // Truncate pointer section
      const WirePointer* ptr = value.pointers + ptrCount;
      while (ptr > value.pointers && ptr[-1].isNull()) --ptr;
      ptrCount = intervalLength(value.pointers, ptr, MAX_STRUCT_POINTER_COUNT);
    }

    auto dataWords = roundBytesUpToWords(dataSize);

    auto totalSize = dataWords + ptrCount * WORDS_PER_POINTER;

    word* ptr = allocate(ref, segment, capTable, totalSize, WirePointer::STRUCT, orphanArena);
    ref->structRef.set(dataWords, ptrCount);

    if (value.dataSize == ONE * BITS) {
      // Data size could be made 0 by truncation
      if (dataSize != ZERO * BYTES) {
        *reinterpret_cast<char*>(ptr) = value.getDataField<bool>(ZERO * ELEMENTS);
      }
    } else {
      copyMemory(reinterpret_cast<byte*>(ptr),
                 reinterpret_cast<const byte*>(value.data),
                 dataSize);
    }

    WirePointer* pointerSection = reinterpret_cast<WirePointer*>(ptr + dataWords);
    for (auto i: kj::zeroTo(ptrCount)) {
      copyPointer(segment, capTable, pointerSection + i,
                  value.segment, value.capTable, value.pointers + i,
                  value.nestingLimit, nullptr, canonical);
    }

    return { segment, ptr };
  }